

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O1

void __thiscall slang::JsonWriter::startObject(JsonWriter *this)

{
  uint uVar1;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  char *local_28 [2];
  ulong local_18;
  
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"{","");
  if (this->pretty == true) {
    uVar1 = this->currentIndent + this->indentSize;
    local_18 = (ulong)uVar1;
    this->currentIndent = uVar1;
    local_28[0] = "";
    fmt.size_ = 6;
    fmt.data_ = "\n{:{}}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_28;
    args.desc_ = 0x1c;
    ::fmt::v9::detail::vformat_to<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
               (locale_ref)0x0);
  }
  return;
}

Assistant:

void JsonWriter::startObject() {
    buffer->append("{");
    if (pretty) {
        currentIndent += indentSize;
        buffer->format("\n{:{}}", "", currentIndent);
    }
}